

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::date_t,duckdb::timestamp_t>
          (BaseAppender *this,Vector *col,date_t input)

{
  timestamp_t tVar1;
  
  tVar1 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(input);
  *(int64_t *)(col->data + (this->chunk).count * 8) = tVar1.value;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}